

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,int num_digits,string_view prefix,
          format_specs specs,hex_writer f)

{
  type tVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  int in_ESI;
  int in_stack_00000008;
  int in_stack_0000000c;
  byte in_stack_00000011;
  type unsiged_width;
  size_t padding;
  char_type fill;
  size_t size;
  undefined4 in_stack_ffffffffffffffb0;
  type in_stack_ffffffffffffffb4;
  format_specs *specs_00;
  undefined4 in_stack_ffffffffffffffc0;
  wchar_t wVar4;
  basic_string_view<char> local_10;
  
  sVar2 = basic_string_view<char>::size(&local_10);
  tVar1 = to_unsigned<int>(in_ESI);
  pwVar3 = fill_t<wchar_t>::operator[]((fill_t<wchar_t> *)&stack0x00000014,0);
  wVar4 = *pwVar3;
  specs_00 = (format_specs *)0x0;
  if ((in_stack_00000011 & 0xf) == 4) {
    in_stack_ffffffffffffffb4 = to_unsigned<int>(in_stack_00000008);
    if (sVar2 + tVar1 < (ulong)in_stack_ffffffffffffffb4) {
      specs_00 = (format_specs *)((ulong)in_stack_ffffffffffffffb4 - (sVar2 + tVar1));
    }
  }
  else if (in_ESI < in_stack_0000000c) {
    basic_string_view<char>::size(&local_10);
    to_unsigned<int>(in_stack_0000000c);
    tVar1 = to_unsigned<int>(in_stack_0000000c - in_ESI);
    specs_00 = (format_specs *)(ulong)tVar1;
    wVar4 = L'0';
  }
  if ((in_stack_00000011 & 0xf) == 0) {
    in_stack_00000011 = in_stack_00000011 & 0xf0 | 2;
  }
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)
             CONCAT44(wVar4,in_stack_ffffffffffffffc0),specs_00,
             (padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::hex_writer>
              *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }